

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DList.h
# Opt level: O3

void __thiscall
DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount>::
Clear<Memory::NoThrowHeapAllocator>
          (DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *this,
          NoThrowHeapAllocator *allocator)

{
  DListNode<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_> *pDVar1;
  DListNode<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_> *buffer;
  
  buffer = (this->super_DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>).next.
           node;
  while (buffer != (DListNode<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_> *)this) {
    pDVar1 = (buffer->super_DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>).
             next.node;
    Memory::SegmentBase<Memory::VirtualAllocWrapper>::~SegmentBase
              (&(buffer->data).super_SegmentBase<Memory::VirtualAllocWrapper>);
    Memory::NoThrowHeapAllocator::Free(allocator,buffer,0x98);
    buffer = pDVar1;
  }
  (this->super_DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>).next.list =
       this;
  (this->super_DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>).prev.list =
       this;
  (this->super_RealCount).count = 0;
  return;
}

Assistant:

void Clear(TAllocator * allocator)
    {
        NodeBase * current = this->Next();
        while (!this->IsHead(current))
        {
            NodeBase * next = current->Next();
            AllocatorDelete(TAllocator, allocator, (Node *)current);
            current = next;
        }

        this->Next() = this;
        this->Prev() = this;
        this->SetCount(0);
    }